

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureUnitCase::uploadCubeTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  TextureCube *pTVar1;
  long lVar2;
  deUint32 err;
  TextureFormat texFormat;
  TransferFormat TVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long local_70;
  
  pTVar1 = (this->m_texturesCube).
           super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[texNdx]];
  texFormat = glu::mapGLInternalFormat
                        ((this->m_textureParams).
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat);
  TVar3 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  local_70 = 0;
  do {
    if (0 < (int)((ulong)((long)pTVar1->m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&pTVar1->m_access[0].
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data) >> 3) * -0x33333333) {
      lVar6 = 8;
      lVar5 = 8;
      uVar4 = 0;
      do {
        if (*(long *)((long)pTVar1->m_data[local_70].
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar5) != 0) {
          lVar2 = (long)pTVar1->m_access[local_70].
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          (*context->_vptr_Context[0x11])
                    (context,(ulong)*(uint *)(s_cubeFaceTargets + local_70 * 4),uVar4 & 0xffffffff,
                     (ulong)(this->m_textureParams).
                            super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                            ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat,
                     (ulong)*(uint *)(lVar2 + lVar6),(ulong)*(uint *)(lVar2 + 4 + lVar6),0,TVar3,
                     (ulong)TVar3 >> 0x20,*(undefined8 *)(lVar2 + 0x18 + lVar6));
          err = (*context->_vptr_Context[0x79])(context);
          glu::checkError(err,"Set cube map image data",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                          ,0x44d);
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x10;
        lVar6 = lVar6 + 0x28;
      } while ((long)uVar4 <
               (long)((int)((ulong)((long)pTVar1->m_access[0].
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   *(long *)&pTVar1->m_access[0].
                                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                             ._M_impl.super__Vector_impl_data) >> 3) * -0x33333333))
      ;
    }
    local_70 = local_70 + 1;
  } while (local_70 != 6);
  return;
}

Assistant:

void TextureUnitCase::uploadCubeTexture (int texNdx, sglr::Context& context)
{
	int							ndxCube		= m_ndxTexType[texNdx];
	const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
		{
			if (texture->isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue;

			tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
			int								width	= access.getWidth();
			int								height	= access.getHeight();

			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

			context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].internalFormat, width, height, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
			GLU_EXPECT_NO_ERROR(context.getError(), "Set cube map image data");
		}
	}
}